

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Metadata(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  undefined8 extraout_RAX;
  uint uVar8;
  ulong uVar9;
  string type;
  string value;
  string an;
  allocator<char> local_91;
  undefined1 *local_90;
  char *local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_90 = &local_80;
  local_88 = (char *)0x0;
  local_80 = 0;
  local_70 = &local_60;
  local_68 = (char *)0x0;
  local_60 = 0;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar5),&local_91);
      iVar5 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar5 != 0) {
        Throw_IncorrectAttr(this,&local_50);
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      pcVar3 = local_88;
      strlen((char *)CONCAT44(extraout_var_00,iVar5));
      std::__cxx11::string::_M_replace((ulong)&local_90,0,pcVar3,CONCAT44(extraout_var_00,iVar5));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar4 != uVar8);
  }
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
  pcVar3 = local_68;
  strlen((char *)CONCAT44(extraout_var_01,iVar5));
  std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar3,CONCAT44(extraout_var_01,iVar5));
  p_Var6 = (_List_node_base *)operator_new(0x90);
  pCVar2 = this->mNodeElement_Cur;
  *(undefined4 *)&p_Var6->_M_prev = 6;
  p_Var6[1]._M_next = p_Var6 + 2;
  p_Var6[1]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var6[2]._M_next = 0;
  p_Var6[3]._M_next = (_List_node_base *)pCVar2;
  p_Var6[4]._M_next = (_List_node_base *)&p_Var6[3]._M_prev;
  p_Var6[3]._M_prev = (_List_node_base *)&p_Var6[3]._M_prev;
  p_Var6[4]._M_prev = (_List_node_base *)0x0;
  p_Var6->_M_next = (_List_node_base *)&PTR__CAMFImporter_NodeElement_Metadata_0080e4a0;
  p_Var6[5]._M_next = p_Var6 + 6;
  p_Var6[5]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var6[6]._M_next = 0;
  p_Var6[7]._M_next = p_Var6 + 8;
  p_Var6[7]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var6[8]._M_next = 0;
  std::__cxx11::string::_M_assign((string *)(p_Var6 + 5));
  std::__cxx11::string::_M_assign((string *)(p_Var6 + 7));
  pCVar2 = this->mNodeElement_Cur;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = p_Var6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(pCVar2->Child).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = p_Var6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Metadata()
{
    std::string type, value;
    CAMFImporter_NodeElement* ne( nullptr );

	// read attribute
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("type", type, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;
	// and value of node.
	value = mReader->getNodeData();
	// Create node element and assign read data.
	ne = new CAMFImporter_NodeElement_Metadata(mNodeElement_Cur);
	((CAMFImporter_NodeElement_Metadata*)ne)->Type = type;
	((CAMFImporter_NodeElement_Metadata*)ne)->Value = value;
	mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}